

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsestream.h
# Opt level: O0

ParseLocation * __thiscall embree::ParseStream::location(ParseStream *this)

{
  ParseLocation *in_RDI;
  Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_00000070;
  ParseLocation *this_00;
  
  this_00 = in_RDI;
  Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::loc
            (in_stack_00000070);
  ParseLocation::ParseLocation(this_00,in_RDI);
  return this_00;
}

Assistant:

ParseLocation location() { return cin->loc(); }